

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void libtorrent::aux::anon_unknown_119::put_mutable_callback
               (item *i,function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *cb)

{
  entry *e;
  signature *psVar1;
  public_key *ppVar2;
  string *psVar3;
  span<const_char> local_118;
  entry local_108;
  undefined1 local_d0 [8];
  string salt;
  sequence_number seq;
  public_key pk;
  signature sig;
  undefined1 local_40 [8];
  entry value;
  function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *cb_local;
  item *i_local;
  
  value.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._32_8_ = cb;
  e = libtorrent::dht::item::value(i);
  entry::entry((entry *)local_40,e);
  psVar1 = libtorrent::dht::item::sig(i);
  pk.bytes._M_elems._24_8_ = *(undefined8 *)(psVar1->bytes)._M_elems;
  ppVar2 = libtorrent::dht::item::pk(i);
  seq.value = *(int64_t *)(ppVar2->bytes)._M_elems;
  pk.bytes._M_elems._0_8_ = *(undefined8 *)((ppVar2->bytes)._M_elems + 8);
  pk.bytes._M_elems._8_8_ = *(undefined8 *)((ppVar2->bytes)._M_elems + 0x10);
  pk.bytes._M_elems._16_8_ = *(undefined8 *)((ppVar2->bytes)._M_elems + 0x18);
  salt.field_2._8_8_ = libtorrent::dht::item::seq(i);
  psVar3 = libtorrent::dht::item::salt_abi_cxx11_(i);
  ::std::__cxx11::string::string((string *)local_d0,(string *)psVar3);
  ::std::
  function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(cb,(entry *)local_40,(array<char,_64UL> *)(pk.bytes._M_elems + 0x18),
               (long *)(salt.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  entry::entry(&local_108,(entry *)local_40);
  span<const_char>::span<char>
            (&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  libtorrent::dht::item::assign
            (i,&local_108,local_118,(sequence_number)salt.field_2._8_8_,(public_key *)&seq,
             (signature *)(pk.bytes._M_elems + 0x18));
  entry::~entry(&local_108);
  ::std::__cxx11::string::~string((string *)local_d0);
  entry::~entry((entry *)local_40);
  return;
}

Assistant:

void put_mutable_callback(dht::item& i
			, std::function<void(entry&, std::array<char, 64>&
				, std::int64_t&, std::string const&)> cb)
		{
			entry value = i.value();
			dht::signature sig = i.sig();
			dht::public_key pk = i.pk();
			dht::sequence_number seq = i.seq();
			std::string salt = i.salt();
			cb(value, sig.bytes, seq.value, salt);
			i.assign(std::move(value), salt, seq, pk, sig);
		}